

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6ValidpathLenConstraintTest14<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section6ValidpathLenConstraintTest14
          (Section6ValidpathLenConstraintTest14<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section6ValidpathLenConstraintTest14<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section6ValidpathLenConstraintTest14(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6ValidpathLenConstraintTest14) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "pathLenConstraint6CACert",
                               "pathLenConstraint6subCA4Cert",
                               "pathLenConstraint6subsubCA41Cert",
                               "pathLenConstraint6subsubsubCA41XCert",
                               "ValidpathLenConstraintTest14EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint6CACRL",
                              "pathLenConstraint6subCA4CRL",
                              "pathLenConstraint6subsubCA41CRL",
                              "pathLenConstraint6subsubsubCA41XCRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.14";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}